

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

bool __thiscall
Shell::Options::InputFileOptionValue::setValue(InputFileOptionValue *this,string *value)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  string *in_RSI;
  long in_RDI;
  bool bVar4;
  int e;
  int b;
  char *name;
  int length;
  string local_50 [32];
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  string *local_18;
  
  local_18 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb8),in_RSI);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_1c = std::__cxx11::string::length();
    local_28 = std::__cxx11::string::c_str();
    iVar2 = local_1c;
    do {
      iVar1 = iVar2;
      local_2c = iVar1 + -1;
      bVar4 = false;
      if (-1 < local_2c) {
        bVar4 = *(char *)(local_28 + local_2c) != '/';
      }
      iVar2 = local_2c;
      local_30 = local_1c;
    } while (bVar4);
    do {
      local_30 = local_30 + -1;
      bVar4 = false;
      if (iVar1 <= local_30) {
        bVar4 = *(char *)(local_28 + local_30) != '.';
      }
    } while (bVar4);
    if (local_30 < iVar1) {
      local_30 = local_1c;
    }
    local_2c = iVar1;
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_18);
    std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0x118) + 0x82d8),local_50);
    std::__cxx11::string::~string(local_50);
  }
  return true;
}

Assistant:

bool Options::InputFileOptionValue::setValue(const std::string& value)
{
  actualValue=value;
  if(value.empty()) return true;

  //update the problem name

  int length = value.length();
  const char* name = value.c_str();

  int b = length - 1;
  while (b >= 0 && name[b] != '/') {
    b--;
  }
  b++;

  int e = length - 1;
  while (e >= b && name[e] != '.') {
    e--;
  }
  if (e < b) {
    e = length;
  }

  parent->_problemName.actualValue=value.substr(b,e-b);

  return true;

}